

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcodecompile.cc
# Opt level: O1

ExprTree * __thiscall
PcodeCompile::createBitRange(PcodeCompile *this,SpecificSymbol *sym,uint4 bitoffset,uint4 numbits)

{
  anon_union_8_2_16792c89_for_value aVar1;
  int iVar2;
  uint constsz;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  VarnodeTpl *vn;
  uintb constval;
  uint uVar4;
  ExprTree *unaff_R13;
  uint uVar5;
  bool bVar6;
  bool bVar7;
  string errmsg;
  undefined1 *local_70;
  char *local_68;
  undefined1 local_60 [16];
  _Alloc_hider local_50;
  anon_union_8_2_16792c89_for_value aStack_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  VarnodeTpl *pVVar3;
  
  local_70 = local_60;
  local_68 = (char *)0x0;
  local_60[0] = 0;
  if (numbits == 0) {
    std::__cxx11::string::_M_replace((ulong)&local_70,0,(char *)0x0,0x34cc7e);
  }
  iVar2 = (*(sym->super_TripleSymbol).super_SleighSymbol._vptr_SleighSymbol[0xc])(sym);
  pVVar3 = (VarnodeTpl *)CONCAT44(extraout_var,iVar2);
  constsz = numbits + 7 >> 3;
  uVar5 = numbits & 7;
  bVar7 = uVar5 != 0;
  if (((((uVar5 == 0 && bitoffset == 0) && local_68 == (char *)0x0) &&
       ((pVVar3->space).type == handle)) && ((pVVar3->size).type == real)) &&
     ((pVVar3->size).value_real == 0)) {
    ConstTpl::ConstTpl((ConstTpl *)&local_50,real,(ulong)constsz);
    aVar1._4_4_ = aStack_48._4_4_;
    aVar1.handle_index = aStack_48.handle_index;
    *(ulong *)((long)&(pVVar3->size).value + 4) =
         CONCAT44(local_40._M_allocated_capacity._0_4_,aStack_48._4_4_);
    *(undefined8 *)((long)&(pVVar3->size).value_real + 4) = local_40._4_8_;
    *(pointer *)&pVVar3->size = local_50._M_p;
    (pVVar3->size).value = aVar1;
    unaff_R13 = (ExprTree *)operator_new(0x10);
    ExprTree::ExprTree(unaff_R13,pVVar3);
  }
  else {
    if (local_68 == (char *)0x0) {
      vn = buildTruncatedVarnode(this,pVVar3,bitoffset,numbits);
      if (vn != (VarnodeTpl *)0x0) {
        unaff_R13 = (ExprTree *)operator_new(0x10);
        ExprTree::ExprTree(unaff_R13,vn);
        if (pVVar3 != (VarnodeTpl *)0x0) {
          operator_delete(pVVar3);
        }
      }
      if (vn != (VarnodeTpl *)0x0) goto LAB_003357f9;
    }
    bVar6 = true;
    if (((pVVar3->size).type == real) && (uVar4 = (uint)(pVVar3->size).value_real, uVar4 != 0)) {
      bVar6 = constsz < uVar4;
      uVar4 = uVar4 << 3;
      if (uVar4 <= bitoffset || uVar4 < numbits + bitoffset) {
        std::__cxx11::string::_M_replace((ulong)&local_70,0,local_68,0x34cd02);
      }
      bVar7 = numbits + bitoffset != uVar4 && uVar5 != 0;
    }
    uVar5 = bitoffset >> 3;
    constval = 0;
    if ((bool)((bitoffset & 7) == 0 & bVar6)) {
      bitoffset = 0;
      constval = (ulong)uVar5;
    }
    if (((!bVar7) && (!bVar6)) && (bitoffset == 0)) {
      std::__cxx11::string::_M_replace((ulong)&local_70,0,local_68,0x34cd12);
    }
    if (bVar7 && 0x47 < numbits + 7) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_50,
                     "Illegal masked bitrange producing varnode larger than 64 bits: ",
                     &(sym->super_TripleSymbol).super_SleighSymbol.name);
      std::__cxx11::string::operator=((string *)&local_70,(string *)&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_p != &local_40) {
        operator_delete(local_50._M_p);
      }
    }
    unaff_R13 = (ExprTree *)operator_new(0x10);
    ExprTree::ExprTree(unaff_R13,pVVar3);
    if (local_68 == (char *)0x0) {
      if (bitoffset != 0) {
        appendOp(this,CPUI_INT_RIGHT,unaff_R13,(ulong)bitoffset,4);
      }
      if (bVar6) {
        appendOp(this,CPUI_SUBPIECE,unaff_R13,constval,4);
      }
      if (bVar7) {
        appendOp(this,CPUI_INT_AND,unaff_R13,(2L << ((char)numbits - 1U & 0x3f)) - 1,constsz);
      }
      pVVar3 = unaff_R13->outvn;
      ConstTpl::ConstTpl((ConstTpl *)&local_50,real,(ulong)constsz);
      force_size(pVVar3,(ConstTpl *)&local_50,unaff_R13->ops);
    }
    else {
      iVar2 = (*this->_vptr_PcodeCompile[4])(this,sym);
      (*this->_vptr_PcodeCompile[5])(this,CONCAT44(extraout_var_00,iVar2),&local_70);
    }
  }
LAB_003357f9:
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  return unaff_R13;
}

Assistant:

ExprTree *PcodeCompile::createBitRange(SpecificSymbol *sym,uint4 bitoffset,uint4 numbits)

{ // Create an expression computing the indicated bitrange of sym
  // The result is truncated to the smallest byte size that can
  // contain the indicated number of bits. The result has the
  // desired bits shifted all the way to the right
  string errmsg;
  if (numbits == 0)
    errmsg = "Size of bitrange is zero";
  VarnodeTpl *vn = sym->getVarnode();
  uint4 finalsize = (numbits+7)/8; // Round up to neareast byte size
  uint4 truncshift = 0;
  bool maskneeded = ((numbits%8)!=0);
  bool truncneeded = true;

  // Special case where we can set the size, without invoking
  // a truncation operator
  if ((errmsg.size()==0)&&(bitoffset==0)&&(!maskneeded)) {
    if ((vn->getSpace().getType()==ConstTpl::handle)&&vn->isZeroSize()) {
      vn->setSize(ConstTpl(ConstTpl::real,finalsize));
      ExprTree *res = new ExprTree(vn);
      //      VarnodeTpl *cruft = buildTemporary();
      //      delete cruft;
      return res;
    }
  }

  if (errmsg.size()==0) {
    VarnodeTpl *truncvn = buildTruncatedVarnode(vn,bitoffset,numbits);
    if (truncvn != (VarnodeTpl *)0) { // If we are able to construct a simple truncated varnode
      ExprTree *res = new ExprTree(truncvn); // Return just the varnode as an expression
      delete vn;
      return res;
    }
  }

  if (vn->getSize().getType()==ConstTpl::real) {
    // If we know the size of the input varnode, we can
    // do some immediate checks, and possibly simplify things
    uint4 insize = vn->getSize().getReal();
    if (insize > 0) {
      truncneeded = (finalsize < insize);
      insize *= 8;		// Convert to number of bits
      if ((bitoffset >= insize)||(bitoffset+numbits > insize))
	errmsg = "Bitrange is bad";
      if (maskneeded && ((bitoffset+numbits)==insize))
	maskneeded = false;
    }
  }

  uintb mask = (uintb)2;
  mask = ((mask<<(numbits-1))-1);
  
  if (truncneeded && ((bitoffset % 8)==0)) {
    truncshift = bitoffset/8;
    bitoffset = 0;
  }

  if ((bitoffset==0)&&(!truncneeded)&&(!maskneeded))
    errmsg = "Superfluous bitrange";

  if (maskneeded && (finalsize > 8))
    errmsg = "Illegal masked bitrange producing varnode larger than 64 bits: " + sym->getName();

  ExprTree *res = new ExprTree(vn);

  if (errmsg.size()>0) {	// Check for error condition
    reportError(getLocation(sym), errmsg);
    return res;
  }

  if (bitoffset !=0)
    appendOp(CPUI_INT_RIGHT,res,bitoffset,4);
  if (truncneeded)
    appendOp(CPUI_SUBPIECE,res,truncshift,4);
  if (maskneeded)
    appendOp(CPUI_INT_AND,res,mask,finalsize);
  force_size(res->outvn,ConstTpl(ConstTpl::real,finalsize),*res->ops);
  return res;
}